

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool comparesEqual(QUrlQuery *lhs,QUrlQuery *rhs)

{
  QUrlQueryPrivate *pQVar1;
  QUrlQueryPrivate *pQVar2;
  compare_eq_result_container<QList<pair<QString,_QString>_>,_std::pair<QString,_QString>_> cVar3;
  QUrlQueryPrivate *pQVar4;
  
  pQVar1 = (rhs->d).d.ptr;
  pQVar2 = (lhs->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  pQVar4 = pQVar1;
  if ((pQVar2 == (QUrlQueryPrivate *)0x0) || (pQVar4 = pQVar2, pQVar1 == (QUrlQueryPrivate *)0x0)) {
    if (((pQVar4->valueDelimiter).ucs == L'=') && ((pQVar4->pairDelimiter).ucs == L'&')) {
      return (pQVar4->itemList).d.size == 0;
    }
  }
  else if (((pQVar2->valueDelimiter).ucs == (pQVar1->valueDelimiter).ucs) &&
          ((pQVar2->pairDelimiter).ucs == (pQVar1->pairDelimiter).ucs)) {
    cVar3 = QList<std::pair<QString,QString>>::operator==
                      ((QList<std::pair<QString,QString>> *)&pQVar2->itemList,&pQVar1->itemList);
    return cVar3;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }